

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

id_t __thiscall libchars::validation::get_vtype_by_name(validation *this,char *name)

{
  iterator iVar1;
  _Rb_tree_color _Var2;
  key_type local_48;
  allocator<char> local_21;
  
  _Var2 = _S_red;
  if (name != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_21);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    _Var2 = _S_red;
    if ((_Rb_tree_header *)iVar1._M_node != &(this->n2i)._M_t._M_impl.super__Rb_tree_header) {
      _Var2 = iVar1._M_node[2]._M_color;
    }
  }
  return _Var2;
}

Assistant:

const validator::id_t validation::get_vtype_by_name(const char *name)
    {
        if (name == NULL)
            return validator::NONE;

        vtype_by_name_t::const_iterator ni = n2i.find(name);
        if (ni != n2i.end())
            return ni->second;
        else
            return validator::NONE;
    }